

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAA_ELSI.cpp
# Opt level: O1

void __thiscall
GMAA_MAA_ELSI::Fill_joI_Array
          (GMAA_MAA_ELSI *this,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI,Index *joI_arr)

{
  MultiAgentDecisionProcessDiscreteInterface *pMVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ObservationHistoryTree *pOVar4;
  undefined4 extraout_var_00;
  Index IVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ObservationHistory *oh;
  vector<const_ObservationHistory_*,_std::allocator<const_ObservationHistory_*>_> indOH;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indOHI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  Index local_70;
  uint local_6c;
  void *local_68;
  iterator iStack_60;
  ObservationHistory **local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_70 = ts;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,indTypes);
  local_68 = (void *)0x0;
  iStack_60._M_current = (ObservationHistory **)0x0;
  local_58 = (ObservationHistory **)0x0;
  uVar7 = 0;
  while( true ) {
    iVar3 = (*(this->super_GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete).
              super_PlanningUnitFactoredDecPOMDPDiscrete.super_PlanningUnitDecPOMDPDiscrete.
              super_PlanningUnitMADPDiscrete.super_PlanningUnit._vptr_PlanningUnit[6])(this);
    uVar8 = (ulong)uVar7;
    if (CONCAT44(extraout_var,iVar3) <= uVar8) break;
    IVar5 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] +
            (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar8];
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8] = IVar5;
    pOVar4 = PlanningUnitMADPDiscrete::GetObservationHistoryTree
                       ((PlanningUnitMADPDiscrete *)this,uVar7,IVar5);
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(pOVar4->super_TreeNode<ObservationHistory>)._m_containedElem;
    if (iStack_60._M_current == local_58) {
      std::vector<ObservationHistory_const*,std::allocator<ObservationHistory_const*>>::
      _M_realloc_insert<ObservationHistory_const*const&>
                ((vector<ObservationHistory_const*,std::allocator<ObservationHistory_const*>> *)
                 &local_68,iStack_60,(ObservationHistory **)&local_88);
    }
    else {
      *iStack_60._M_current =
           (ObservationHistory *)
           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      iStack_60._M_current = iStack_60._M_current + 1;
    }
    uVar7 = uVar7 + 1;
  }
  if (-1 < (int)(local_70 - 1)) {
    uVar8 = (ulong)(local_70 - 1);
    do {
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      uVar7 = 0;
      while( true ) {
        iVar3 = (*(this->super_GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete).
                  super_PlanningUnitFactoredDecPOMDPDiscrete.super_PlanningUnitDecPOMDPDiscrete.
                  super_PlanningUnitMADPDiscrete.super_PlanningUnit._vptr_PlanningUnit[6])(this);
        uVar6 = (ulong)uVar7;
        if (CONCAT44(extraout_var_00,iVar3) <= uVar6) break;
        local_6c = *(uint *)(*(long *)((long)local_68 + uVar6 * 8) + 0x14);
        if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_88,
                     (iterator)
                     local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_6c);
        }
        else {
          *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_6c;
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        *(undefined8 *)((long)local_68 + uVar6 * 8) =
             *(undefined8 *)(*(long *)((long)local_68 + uVar6 * 8) + 0x20);
        uVar7 = uVar7 + 1;
      }
      pMVar1 = (this->super_GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete).
               super_PlanningUnitFactoredDecPOMDPDiscrete.super_PlanningUnitDecPOMDPDiscrete.
               super_PlanningUnitMADPDiscrete._m_madp;
      IVar5 = (**(code **)((long)*pMVar1 + 0xe0))(pMVar1,&local_88);
      joI_arr[uVar8] = IVar5;
      if ((ObservationHistory *)
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (ObservationHistory *)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      bVar2 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar2);
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GMAA_MAA_ELSI::Fill_joI_Array(const Index ts, 
        const vector<Index>& indTypes, 
        const vector<Index>& firstOHtsI, 
        Index* joI_arr)
{           
    //convert indiv type indices to ind. observation history indices:
    vector<Index> indOHI = vector<Index>(indTypes);
    vector<const ObservationHistory*> indOH;
    for(Index agentI=0; agentI < GetNrAgents(); agentI++)
    {
        indOHI[agentI] += firstOHtsI[agentI];
        const ObservationHistoryTree* oht = 
            GetObservationHistoryTree(agentI, indOHI[agentI]);
        const ObservationHistory* oh = oht->GetObservationHistory();
        indOH.push_back(oh);
    }
    //convert the vector of  ind. observation history indices to a array of
    //joint observations
    for(int tI=ts-1; tI >= 0; tI--)
    {
        vector<Index> indivObservationsTI;
        for(Index agentI=0; agentI < GetNrAgents(); agentI++)
        {
            indivObservationsTI.push_back( indOH[agentI]->
                    GetLastObservationIndex() );
            indOH[agentI] =  indOH[agentI]->GetPredecessor();
        }
        joI_arr[tI] = IndividualToJointObservationIndices(
                indivObservationsTI);
    }
}